

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gz_comp(gz_statep state,int flush)

{
  uInt uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *msg;
  ulong uVar5;
  
  if ((state->size == 0) && (iVar2 = gz_init(state), iVar2 == -1)) {
    return -1;
  }
  iVar2 = 0;
  do {
    if ((state->strm).avail_out == 0) {
LAB_004a8c6c:
      uVar5 = (long)(state->strm).next_out - (long)state->next;
      iVar2 = (int)uVar5;
      if (iVar2 != 0) {
        sVar3 = write(state->fd,state->next,uVar5 & 0xffffffff);
        if (((int)sVar3 < 0) || ((int)sVar3 != iVar2)) {
          piVar4 = __errno_location();
          msg = strerror(*piVar4);
          gz_error(state,-1,msg);
          return -1;
        }
      }
      if ((state->strm).avail_out == 0) {
        (state->strm).avail_out = state->size;
        (state->strm).next_out = state->out;
      }
      state->next = (state->strm).next_out;
    }
    else if ((flush != 0) && (flush != 4 || iVar2 == 1)) goto LAB_004a8c6c;
    uVar1 = (state->strm).avail_out;
    iVar2 = deflate((z_streamp_conflict)&state->strm,flush);
    if (iVar2 == -2) {
      gz_error(state,-2,"internal error: deflate stream corrupt");
      return -1;
    }
    if (uVar1 == (state->strm).avail_out) {
      if (flush == 4) {
        deflateReset((z_streamp_conflict)&state->strm);
      }
      return 0;
    }
  } while( true );
}

Assistant:

local int gz_comp(gz_statep state, int flush)
{
    int ret, got;
    unsigned have;
    z_streamp strm = &(state->strm);

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return -1;

    /* run deflate() on provided input until it produces no more output */
    ret = Z_OK;
    do {
        /* write out current buffer contents if full, or if flushing, but if
           doing Z_FINISH then don't write until we get to Z_STREAM_END */
        if (strm->avail_out == 0 || (flush != Z_NO_FLUSH &&
            (flush != Z_FINISH || ret == Z_STREAM_END))) {
            have = (unsigned)(strm->next_out - state->next);
            if (have && ((got = write(state->fd, state->next, have)) < 0 ||
                         (unsigned)got != have)) {
                gz_error(state, Z_ERRNO, zstrerror());
                return -1;
            }
            if (strm->avail_out == 0) {
                strm->avail_out = state->size;
                strm->next_out = state->out;
            }
            state->next = strm->next_out;
        }

        /* compress */
        have = strm->avail_out;
        ret = deflate(strm, flush);
        if (ret == Z_STREAM_ERROR) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: deflate stream corrupt");
            return -1;
        }
        have -= strm->avail_out;
    } while (have);

    /* if that completed a deflate stream, allow another to start */
    if (flush == Z_FINISH)
        deflateReset(strm);

    /* all done, no errors */
    return 0;
}